

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t __n;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar2 = &local_98.field_2;
  uVar9 = 0;
  local_78 = leader;
  do {
    __n = input->_M_string_length - uVar9;
    if (input->_M_string_length < uVar9 || __n == 0) break;
    pcVar3 = (input->_M_dataplus)._M_p;
    pvVar4 = memchr(pcVar3 + uVar9,10,__n);
    lVar7 = (long)pvVar4 - (long)pcVar3;
    uVar9 = 0xffffffffffffffff;
    if (lVar7 != -1 && pvVar4 != (void *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,input,0,lVar7 + 1U);
      pbVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50,(local_78->_M_dataplus)._M_p,local_78->_M_string_length);
      local_98._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar6) {
        local_98.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_98._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_98._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b8,input,lVar7 + 1U,0xffffffffffffffff);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        uVar8 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_b8._M_string_length + local_98._M_string_length) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          uVar8 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_b8._M_string_length + local_98._M_string_length) goto LAB_0015dc8b;
        pbVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b8,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
      }
      else {
LAB_0015dc8b:
        pbVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_98,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      }
      local_70._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar6) {
        local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_70._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      paVar6->_M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (input,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar9 = lVar7 + local_78->_M_string_length;
    }
  } while (uVar9 != 0xffffffffffffffff);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (input->_M_dataplus)._M_p;
  paVar1 = &input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar8 = *(undefined8 *)((long)&input->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = input->_M_string_length;
  (input->_M_dataplus)._M_p = (pointer)paVar1;
  input->_M_string_length = 0;
  (input->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}